

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

void __thiscall Clasp::DefaultUnfoundedCheck::createLoopFormula(DefaultUnfoundedCheck *this)

{
  bool bVar1;
  size_type sVar2;
  Solver *s;
  reference pLVar3;
  LoopFormula *con;
  Antecedent *this_00;
  uint64 *puVar4;
  long in_RDI;
  Result RVar5;
  Literal p;
  Antecedent ante;
  Solver *in_stack_ffffffffffffff58;
  reference in_stack_ffffffffffffff60;
  Constraint *in_stack_ffffffffffffff68;
  Solver *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  size_type in_stack_ffffffffffffff7c;
  Solver *in_stack_ffffffffffffff80;
  LitVec *in_stack_ffffffffffffff88;
  Antecedent local_40;
  ClauseHead *local_38;
  Status local_30;
  ClauseHead *local_28;
  Status local_20;
  Antecedent local_18;
  Antecedent local_10 [2];
  
  Antecedent::Antecedent(local_10);
  s = (Solver *)
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 200),0);
  pLVar3 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                     ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0xd8)
                      ,0);
  pLVar3->rep_ = (s->rng).seed_;
  sVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                    ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 200));
  if (sVar2 == 1) {
    RVar5 = ClauseCreator::create
                      (s,in_stack_ffffffffffffff88,
                       (uint32)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                       (ConstraintInfo *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_38 = RVar5.local;
    local_30 = RVar5.status;
    local_28 = local_38;
    local_20 = local_30;
    Antecedent::Antecedent(&local_18,&local_38->super_Constraint);
    local_10[0].data_ = local_18.data_;
  }
  else {
    in_stack_ffffffffffffff68 = *(Constraint **)(in_RDI + 0x10);
    in_stack_ffffffffffffff60 =
         bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                   ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0xd8),0
                   );
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0xd8));
    ClauseRep::prepared(in_stack_ffffffffffffff60,(uint32)((ulong)in_stack_ffffffffffffff58 >> 0x20)
                        ,(Info *)0x210e1c);
    in_stack_ffffffffffffff70 =
         (Solver *)
         bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                   ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 200),0)
    ;
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 200));
    con = LoopFormula::newLoopFormula
                    (in_stack_ffffffffffffff80,
                     (ClauseRep *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     (Literal *)in_stack_ffffffffffffff70,
                     (uint32)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                     SUB81((ulong)in_stack_ffffffffffffff68 >> 0x18,0));
    Antecedent::Antecedent(&local_40,&con->super_Constraint);
    local_10[0].data_ = local_40.data_;
    in_stack_ffffffffffffff80 = *(Solver **)(in_RDI + 0x10);
    Antecedent::constraint(local_10);
    in_stack_ffffffffffffff7c =
         bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                   ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 200));
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0xd8));
    Solver::addLearnt(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                      (uint32)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                      (ConstraintType)in_stack_ffffffffffffff60);
  }
  do {
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::back
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 200));
    this_00 = Solver::reason(in_stack_ffffffffffffff58,
                             (Literal)(uint32)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    in_stack_ffffffffffffff58 = (Solver *)Antecedent::asUint(this_00);
    puVar4 = Antecedent::asUint(local_10);
    if (in_stack_ffffffffffffff58 != (Solver *)*puVar4) {
      Solver::setReason((Solver *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (Literal)(uint32)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                        (Antecedent *)in_stack_ffffffffffffff70,
                        (uint32)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    }
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pop_back
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 200));
    bVar1 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::empty
                      ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 200)
                      );
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

void DefaultUnfoundedCheck::createLoopFormula() {
	assert(activeClause_.size() > 3 && !loopAtoms_.empty());
	Antecedent ante;
	activeClause_[0] = loopAtoms_[0];
	if (loopAtoms_.size() == 1) {
		ante = ClauseCreator::create(*solver_, activeClause_, ClauseCreator::clause_no_prepare, info_).local;
	}
	else {
		assert(!info_.tagged() && !info_.aux());
		ante = LoopFormula::newLoopFormula(*solver_
			, ClauseRep::prepared(&activeClause_[0], (uint32)activeClause_.size(), info_)
			, &loopAtoms_[0], (uint32)loopAtoms_.size());
		solver_->addLearnt(ante.constraint(), uint32(loopAtoms_.size() + activeClause_.size()), Constraint_t::Loop);
	}
	do {
		Literal p = loopAtoms_.back();
		assert(solver_->isTrue(p));
		if (solver_->reason(p).asUint() != ante.asUint()) {
			assert(solver_->reason(p) == this);
			solver_->setReason(p, ante);
		}
		loopAtoms_.pop_back();
	} while (!loopAtoms_.empty());
}